

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Parser * __thiscall
Catch::clara::detail::Parser::operator|(Parser *__return_storage_ptr__,Parser *this,Help *other)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_> local_60;
  vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_> local_48;
  
  peVar1 = (this->m_exeName).m_name.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->m_exeName).m_name.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  peVar2 = (this->m_exeName).m_ref.
           super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->m_exeName).m_ref.
            super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::vector
            (&local_60,&this->m_options);
  std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::vector
            (&local_48,&this->m_args);
  std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::push_back
            (&local_60,&other->super_Opt);
  (__return_storage_ptr__->super_ParserBase)._vptr_ParserBase = (_func_int **)&PTR__Parser_00185e38;
  (__return_storage_ptr__->m_exeName).super_ComposableParserImpl<Catch::clara::detail::ExeName>.
  super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__ExeName_00185770;
  (__return_storage_ptr__->m_exeName).m_name.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  (__return_storage_ptr__->m_exeName).m_name.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  (__return_storage_ptr__->m_exeName).m_ref.
  super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  (__return_storage_ptr__->m_exeName).m_ref.
  super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::vector
            (&__return_storage_ptr__->m_options,&local_60);
  std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::vector
            (&__return_storage_ptr__->m_args,&local_48);
  std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_48);
  std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_60);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator|( T const &other ) const -> Parser {
            return Parser( *this ) |= other;
        }